

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_mt_test.c
# Opt level: O3

int mt_dec_decode(MpiDecTestCmd *cmd)

{
  MppCodingType MVar1;
  RK_U32 RVar2;
  RK_U32 RVar3;
  FileReader pvVar4;
  MPP_RET MVar5;
  int iVar6;
  MPP_RET MVar7;
  char *pcVar8;
  MppCtx ctx;
  MppApi *mpi;
  MppPacket packet;
  pthread_t thd_out;
  pthread_t thd_in;
  MpiDecMtLoopData data;
  pthread_attr_t attr;
  MppCodingType MVar9;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  pthread_t local_e8;
  pthread_t local_e0;
  MpiDecTestCmd *local_d8;
  long lStack_d0;
  long local_c8;
  ulong uStack_c0;
  undefined8 local_b8;
  DecBufMgr pvStack_b0;
  undefined8 local_a8;
  long lStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  FILE *local_88;
  long lStack_80;
  FileReader local_78;
  undefined8 uStack_70;
  pthread_attr_t local_68;
  
  pvVar4 = cmd->reader;
  local_108 = 0;
  local_100 = 0;
  local_f0 = 0;
  local_f8 = 0;
  MVar1 = cmd->type;
  RVar2 = cmd->width;
  RVar3 = cmd->height;
  local_e8 = 0;
  _mpp_log_l(4,"mpi_dec_mt_test","mpi_dec_mt_test start\n",0);
  local_78 = (FileReader)0x0;
  uStack_70 = 0;
  local_88 = (FILE *)0x0;
  lStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  lStack_a0 = 0;
  local_b8 = 0;
  pvStack_b0 = (DecBufMgr)0x0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = (MpiDecTestCmd *)0x0;
  lStack_d0 = 0;
  if (cmd->have_output != 0) {
    local_88 = fopen(cmd->file_output,"w+b");
    if (local_88 == (FILE *)0x0) {
      MVar5 = MPP_OK;
      _mpp_log_l(2,"mpi_dec_mt_test","failed to open output file %s\n",0,cmd->file_output);
      goto LAB_00104e90;
    }
  }
  MVar5 = dec_buf_mgr_init(&pvStack_b0);
  if (MVar5 == MPP_OK) {
    MVar5 = mpp_packet_init(&local_f0,0,0);
    if (MVar5 == MPP_OK) {
      MVar9 = MVar1;
      _mpp_log_l(4,"mpi_dec_mt_test","mpi_dec_mt_test decoder test start w %d h %d type %d\n",0,
                 RVar2,RVar3,MVar1);
      MVar5 = mpp_create(&local_108,&local_100);
      if (MVar5 == MPP_OK) {
        MVar5 = mpp_init(local_108,0,MVar1);
        if (MVar5 == MPP_OK) {
          local_68.__align._0_4_ = 0xffffffff;
          MVar5 = (**(code **)(local_100 + 0x70))(local_108,0x200007);
          if (MVar5 != MPP_OK) {
            _mpp_log_l(2,"mpi_dec_mt_test","Failed to set output timeout %d ret %d\n",0,
                       local_68.__align._0_4_,MVar5,MVar9);
            goto LAB_00104e90;
          }
          mpp_dec_cfg_init(&local_f8);
          MVar5 = (**(code **)(local_100 + 0x70))(local_108,0x310202,local_f8);
          if (MVar5 == MPP_OK) {
            MVar5 = mpp_dec_cfg_set_u32(local_f8,"base:split_parse",1);
            if (MVar5 == MPP_OK) {
              MVar5 = (**(code **)(local_100 + 0x70))(local_108,0x310201,local_f8);
              if (MVar5 != MPP_OK) {
                _mpp_log_l(2,"mpi_dec_mt_test","%p failed to set cfg %p ret %d\n",0,local_108,
                           local_f8,MVar5);
                goto LAB_00104e90;
              }
              lStack_d0 = local_108;
              local_c8 = local_100;
              uStack_c0 = uStack_c0 & 0xffffffff00000000;
              lStack_a0 = local_f0;
              uStack_90 = 0;
              lStack_80 = (ulong)(uint)cmd->frame_num << 0x20;
              uStack_70 = CONCAT44(uStack_70._4_4_,cmd->quiet);
              local_d8 = cmd;
              local_78 = pvVar4;
              pthread_attr_init(&local_68);
              pthread_attr_setdetachstate(&local_68,0);
              iVar6 = pthread_create(&local_e0,&local_68,thread_input,&local_d8);
              if (iVar6 == 0) {
                iVar6 = pthread_create(&local_e8,&local_68,thread_output,&local_d8);
                if (iVar6 != 0) {
                  pcVar8 = "failed to create thread for output ret %d\n";
                  goto LAB_00105109;
                }
                if (cmd->frame_num < 0) {
                  _mpp_log_l(4,"mpi_dec_mt_test","*******************************************\n",0);
                  _mpp_log_l(4,"mpi_dec_mt_test","**** Press Enter to stop loop decoding ****\n",0);
                  _mpp_log_l(4,"mpi_dec_mt_test","*******************************************\n",0);
                  getc(_stdin);
                  uStack_c0 = CONCAT44(uStack_c0._4_4_,1);
                }
              }
              else {
                pcVar8 = "failed to create thread for input ret %d\n";
LAB_00105109:
                _mpp_log_l(2,"mpi_dec_mt_test",pcVar8,0,iVar6);
              }
              pthread_attr_destroy(&local_68);
              pthread_join(local_e0,(void **)0x0);
              pthread_join(local_e8,(void **)0x0);
              MVar7 = (**(code **)(local_100 + 0x68))(local_108);
              MVar5 = MPP_OK;
              if (MVar7 != MPP_OK) {
                _mpp_log_l(2,"mpi_dec_mt_test","mpi->reset failed\n",0);
                MVar5 = MVar7;
              }
              goto LAB_00104e90;
            }
            pcVar8 = "%p failed to set split_parse ret %d\n";
          }
          else {
            pcVar8 = "%p failed to get decoder cfg ret %d\n";
          }
          _mpp_log_l(2,"mpi_dec_mt_test",pcVar8,0,local_108,MVar5);
          goto LAB_00104e90;
        }
        pcVar8 = "mpp_init failed\n";
      }
      else {
        pcVar8 = "mpp_create failed\n";
      }
    }
    else {
      pcVar8 = "mpp_packet_init failed\n";
    }
  }
  else {
    pcVar8 = "dec_buf_mgr_init failed\n";
  }
  _mpp_log_l(2,"mpi_dec_mt_test",pcVar8,0);
LAB_00104e90:
  if (local_f0 != 0) {
    mpp_packet_deinit(&local_f0);
    local_f0 = 0;
  }
  if (local_108 != 0) {
    mpp_destroy();
    local_108 = 0;
  }
  local_a8 = 0;
  if (pvStack_b0 != (DecBufMgr)0x0) {
    dec_buf_mgr_deinit(pvStack_b0);
    pvStack_b0 = (DecBufMgr)0x0;
  }
  if (local_88 != (FILE *)0x0) {
    fclose(local_88);
    local_88 = (FILE *)0x0;
  }
  if (local_f8 != 0) {
    mpp_dec_cfg_deinit();
  }
  return MVar5;
}

Assistant:

int mt_dec_decode(MpiDecTestCmd *cmd)
{
    MPP_RET ret         = MPP_OK;
    FileReader reader   = cmd->reader;

    // base flow context
    MppCtx ctx          = NULL;
    MppApi *mpi         = NULL;

    // input / output
    MppPacket packet    = NULL;
    MppFrame  frame     = NULL;

    // config for runtime mode
    MppDecCfg cfg       = NULL;
    RK_U32 need_split   = 1;

    // paramter for resource malloc
    RK_U32 width        = cmd->width;
    RK_U32 height       = cmd->height;
    MppCodingType type  = cmd->type;

    pthread_t thd_in;
    pthread_t thd_out = 0;
    pthread_attr_t attr;
    MpiDecMtLoopData data;

    mpp_log("mpi_dec_mt_test start\n");
    memset(&data, 0, sizeof(data));

    if (cmd->have_output) {
        data.fp_output = fopen(cmd->file_output, "w+b");
        if (NULL == data.fp_output) {
            mpp_err("failed to open output file %s\n", cmd->file_output);
            goto MPP_TEST_OUT;
        }
    }

    ret = dec_buf_mgr_init(&data.buf_mgr);
    if (ret) {
        mpp_err("dec_buf_mgr_init failed\n");
        goto MPP_TEST_OUT;
    }

    ret = mpp_packet_init(&packet, NULL, 0);
    if (ret) {
        mpp_err("mpp_packet_init failed\n");
        goto MPP_TEST_OUT;
    }

    mpp_log("mpi_dec_mt_test decoder test start w %d h %d type %d\n", width, height, type);

    // decoder demo
    ret = mpp_create(&ctx, &mpi);
    if (ret) {
        mpp_err("mpp_create failed\n");
        goto MPP_TEST_OUT;
    }

    ret = mpp_init(ctx, MPP_CTX_DEC, type);
    if (ret) {
        mpp_err("mpp_init failed\n");
        goto MPP_TEST_OUT;
    }

    // NOTE: timeout value please refer to MppPollType definition
    //  0   - non-block call (default)
    // -1   - block call
    // +val - timeout value in ms
    {
        MppPollType timeout = MPP_POLL_BLOCK;
        MppParam param = &timeout;

        ret = mpi->control(ctx, MPP_SET_OUTPUT_TIMEOUT, param);
        if (ret) {
            mpp_err("Failed to set output timeout %d ret %d\n", timeout, ret);
            goto MPP_TEST_OUT;
        }
    }

    mpp_dec_cfg_init(&cfg);

    /* get default config from decoder context */
    ret = mpi->control(ctx, MPP_DEC_GET_CFG, cfg);
    if (ret) {
        mpp_err("%p failed to get decoder cfg ret %d\n", ctx, ret);
        goto MPP_TEST_OUT;
    }

    /*
     * split_parse is to enable mpp internal frame spliter when the input
     * packet is not aplited into frames.
     */
    ret = mpp_dec_cfg_set_u32(cfg, "base:split_parse", need_split);
    if (ret) {
        mpp_err("%p failed to set split_parse ret %d\n", ctx, ret);
        goto MPP_TEST_OUT;
    }

    ret = mpi->control(ctx, MPP_DEC_SET_CFG, cfg);
    if (ret) {
        mpp_err("%p failed to set cfg %p ret %d\n", ctx, cfg, ret);
        goto MPP_TEST_OUT;
    }

    data.cmd            = cmd;
    data.ctx            = ctx;
    data.mpi            = mpi;
    data.loop_end       = 0;
    data.packet         = packet;
    data.frame          = frame;
    data.frame_count    = 0;
    data.frame_num      = cmd->frame_num;
    data.reader         = reader;
    data.quiet          = cmd->quiet;

    pthread_attr_init(&attr);
    pthread_attr_setdetachstate(&attr, PTHREAD_CREATE_JOINABLE);

    ret = pthread_create(&thd_in, &attr, thread_input, &data);
    if (ret) {
        mpp_err("failed to create thread for input ret %d\n", ret);
        goto THREAD_END;
    }

    ret = pthread_create(&thd_out, &attr, thread_output, &data);
    if (ret) {
        mpp_err("failed to create thread for output ret %d\n", ret);
        goto THREAD_END;
    }

    if (cmd->frame_num < 0) {
        // wait for input then quit decoding
        mpp_log("*******************************************\n");
        mpp_log("**** Press Enter to stop loop decoding ****\n");
        mpp_log("*******************************************\n");

        getc(stdin);
        data.loop_end = 1;
    }

THREAD_END:
    pthread_attr_destroy(&attr);

    pthread_join(thd_in, NULL);
    pthread_join(thd_out, NULL);

    ret = mpi->reset(ctx);
    if (ret) {
        mpp_err("mpi->reset failed\n");
        goto MPP_TEST_OUT;
    }

MPP_TEST_OUT:
    if (packet) {
        mpp_packet_deinit(&packet);
        packet = NULL;
    }

    if (frame) {
        mpp_frame_deinit(&frame);
        frame = NULL;
    }

    if (ctx) {
        mpp_destroy(ctx);
        ctx = NULL;
    }

    data.frm_grp = NULL;
    if (data.buf_mgr) {
        dec_buf_mgr_deinit(data.buf_mgr);
        data.buf_mgr = NULL;
    }

    if (data.fp_output) {
        fclose(data.fp_output);
        data.fp_output = NULL;
    }

    if (cfg) {
        mpp_dec_cfg_deinit(cfg);
        cfg = NULL;
    }

    return ret;
}